

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::SpectrumImageTexture::Evaluate
          (SpectrumImageTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  Point2f st;
  TextureEvalContext ctx_00;
  undefined1 auVar1 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  RGB rgb_00;
  RGB rgb_01;
  RGB s;
  RGB rgb_02;
  undefined1 auVar5 [16];
  RGB rgb_03;
  RGB rgb_04;
  array<float,_4> aVar6;
  Vector2f dst1;
  Vector2f dst0;
  float *pfVar7;
  Tuple2<pbrt::Point2,_float> in_RDI;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined8 uVar18;
  undefined1 auVar19 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  SampledSpectrum SVar24;
  RGB RVar25;
  float unaff_retaddr;
  float unaff_retaddr_00;
  float in_stack_00000008;
  undefined8 in_stack_0000000c;
  undefined1 in_stack_00000014 [52];
  undefined1 in_stack_00000048 [12];
  RGBColorSpace *cs;
  RGB rgb;
  TexCoord2D c;
  float y;
  Float x;
  undefined4 uVar26;
  undefined4 uVar27;
  int max;
  int min;
  undefined4 uVar28;
  Float a;
  SampledWavelengths *lambda_00;
  RGBUnboundedSpectrum *this_00;
  Float FVar29;
  undefined4 uVar30;
  Float FVar31;
  undefined4 uVar32;
  Float FVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 in_stack_fffffffffffffd74;
  undefined8 in_stack_fffffffffffffd78;
  Float in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  RGBColorSpace *cs_00;
  int i;
  float fVar36;
  Float FVar37;
  undefined1 local_19c [12];
  RGB local_190;
  RGB local_180 [2];
  RGBColorSpace *local_160;
  RGB local_158;
  RGB local_148;
  RGB local_138;
  RGB local_128;
  RGB local_118;
  RGB local_10c;
  RGB local_100;
  RGB local_f4;
  RGB local_e8;
  undefined8 local_d8;
  Float local_d0;
  undefined8 local_c8;
  Float local_c0;
  Tuple2<pbrt::Point2,_float> local_a8;
  undefined8 local_a0;
  Float local_98;
  RGB local_94;
  undefined1 auStack_88 [12];
  undefined1 local_7c [52];
  undefined1 auStack_48 [12];
  Tuple2<pbrt::Point2,_float> local_30;
  Tuple2<pbrt::Point2,_float> this_01;
  int local_10;
  float in_stack_fffffffffffffff4;
  float in_stack_fffffffffffffff8;
  float in_stack_fffffffffffffffc;
  undefined1 auVar2 [40];
  undefined1 auVar23 [56];
  
  auVar9._4_8_ = in_stack_0000000c;
  auVar9._0_4_ = in_stack_00000008;
  auVar9._12_52_ = in_stack_00000014;
  auVar8 = vmovdqu64_avx512f(auVar9);
  auVar10._52_12_ = in_stack_00000048;
  auVar10._0_52_ = in_stack_00000014;
  auVar9 = vmovdqu64_avx512f(auVar10);
  auVar9 = vmovdqu64_avx512f(auVar9);
  auStack_48 = auVar9._52_12_;
  auVar9 = vmovdqu64_avx512f(auVar8);
  auStack_88 = auVar9._0_12_;
  local_7c = auVar9._12_52_;
  auVar10 = vmovdqu64_avx512f(auVar9);
  auVar8._52_12_ = auStack_48;
  auVar8._0_52_ = local_7c;
  auVar9 = vmovdqu64_avx512f(auVar8);
  auVar9 = vmovdqu64_avx512f(auVar9);
  FVar33 = auVar9._52_4_;
  uVar34 = auVar9._56_4_;
  uVar35 = auVar9._60_4_;
  auVar9 = vmovdqu64_avx512f(auVar10);
  y = auVar9._0_4_;
  x = auVar9._4_4_;
  uVar26 = auVar9._8_4_;
  uVar27 = auVar9._12_4_;
  max = auVar9._16_4_;
  min = auVar9._20_4_;
  uVar28 = auVar9._24_4_;
  a = auVar9._28_4_;
  lambda_00 = auVar9._32_8_;
  this_00 = auVar9._40_8_;
  FVar29 = auVar9._48_4_;
  uVar30 = auVar9._52_4_;
  FVar31 = auVar9._56_4_;
  uVar32 = auVar9._60_4_;
  cs_00 = (RGBColorSpace *)&stack0xffffffffffffffd0;
  auVar2 = auVar9._24_40_;
  ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.y = FVar33;
  auVar1 = auVar2._0_12_;
  auVar3 = auVar2._12_12_;
  auVar4 = auVar2._24_12_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar1._0_4_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar1._4_4_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar1._8_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar3._0_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar3._4_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar3._8_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar4._0_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar4._4_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar4._8_4_;
  ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar2._36_4_;
  ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)uVar34;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uVar35;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_fffffffffffffd74;
  ctx_00._56_8_ = in_stack_fffffffffffffd78;
  ctx_00.dvdx = in_stack_fffffffffffffd80;
  ctx_00.dvdy = (Float)in_stack_fffffffffffffd84;
  ctx_00.faceIndex = in_stack_fffffffffffffd88;
  this_01 = in_RDI;
  TextureMapping2D::Map(auVar9._8_8_,ctx_00);
  i = 1;
  pfVar7 = Tuple2<pbrt::Point2,_float>::operator[]((Tuple2<pbrt::Point2,_float> *)cs_00,1);
  fVar36 = 1.0 - *pfVar7;
  pfVar7 = Tuple2<pbrt::Point2,_float>::operator[]((Tuple2<pbrt::Point2,_float> *)cs_00,i);
  *pfVar7 = fVar36;
  local_a8 = local_30;
  Vector2<float>::Vector2((Vector2<float> *)CONCAT44(uVar27,uVar26),x,y);
  Vector2<float>::Vector2((Vector2<float> *)CONCAT44(uVar27,uVar26),x,y);
  uVar18 = 0;
  st.super_Tuple2<pbrt::Point2,_float>.y = in_stack_00000008;
  st.super_Tuple2<pbrt::Point2,_float>.x = unaff_retaddr_00;
  dst0.super_Tuple2<pbrt::Vector2,_float>.y = unaff_retaddr;
  dst0.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_fffffffffffffffc;
  dst1.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_fffffffffffffff8;
  dst1.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_fffffffffffffff4;
  RVar25 = MIPMap::Filter<pbrt::RGB>((MIPMap *)this_01,st,dst0,dst1);
  local_d0 = RVar25.b;
  auVar19 = (undefined1  [56])0x0;
  FVar37 = RVar25.g;
  auVar5._8_8_ = uVar18;
  auVar5._0_8_ = RVar25._0_8_;
  local_d8 = vmovlpd_avx(auVar5);
  RVar25.g = (Float)uVar30;
  RVar25.r = FVar29;
  RVar25.b = FVar31;
  local_c8 = local_d8;
  local_c0 = local_d0;
  local_a0 = local_d8;
  local_98 = local_d0;
  RVar25 = pbrt::operator*(a,RVar25);
  local_100.b = RVar25.b;
  auVar11._0_8_ = RVar25._0_8_;
  auVar11._8_56_ = auVar19;
  local_100._0_8_ = vmovlpd_avx(auVar11._0_16_);
  local_e8._0_8_ = local_100._0_8_;
  local_e8.b = local_100.b;
  local_94._0_8_ = local_100._0_8_;
  local_94.b = local_100.b;
  if ((((MIPMapFilterOptions *)((long)in_RDI + 0x2c))->filter & Bilinear) != Point) {
    RGB::RGB(&local_10c,1.0,1.0,1.0);
    local_118.b = local_94.b;
    local_118.r = local_94.r;
    local_118.g = local_94.g;
    local_128.b = local_94.b;
    local_128.r = local_94.r;
    local_128.g = local_94.g;
    auVar19 = ZEXT856(0);
    s.b = in_stack_fffffffffffffd80;
    s.r = (Float)(int)in_stack_fffffffffffffd78;
    s.g = (Float)(int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
    RVar25 = RGB::operator-((RGB *)CONCAT44(uVar32,FVar31),s);
    local_138.b = RVar25.b;
    auVar12._0_8_ = RVar25._0_8_;
    auVar12._8_56_ = auVar19;
    local_138._0_8_ = vmovlpd_avx(auVar12._0_16_);
    local_100._0_8_ = local_138._0_8_;
    local_100.b = local_138.b;
  }
  local_148.b = local_100.b;
  local_148.r = local_100.r;
  local_148.g = local_100.g;
  auVar19 = ZEXT856(0);
  rgb_01.g = (Float)uVar32;
  rgb_01.r = FVar31;
  rgb_01.b = FVar33;
  RVar25 = ClampZero(rgb_01);
  local_158.b = RVar25.b;
  auVar13._0_8_ = RVar25._0_8_;
  auVar13._8_56_ = auVar19;
  local_158._0_8_ = vmovlpd_avx(auVar13._0_16_);
  local_f4._0_8_ = local_158._0_8_;
  local_f4.b = local_158.b;
  local_94._0_8_ = local_158._0_8_;
  local_94.b = local_158.b;
  local_160 = MIPMap::GetRGBColorSpace(*(MIPMap **)((long)in_RDI + 0x30));
  if (local_160 == (RGBColorSpace *)0x0) {
    RGB::operator[](&local_94,0);
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)CONCAT44(uVar27,uVar26),x);
  }
  else if (*(int *)&(((MIPMap *)((long)in_RDI + 0x38))->pyramid).alloc.memoryResource == 2) {
    local_180[0].b = local_94.b;
    local_180[0].r = local_94.r;
    local_180[0].g = local_94.g;
    local_190.b = local_94.b;
    local_190.r = local_94.r;
    local_190.g = local_94.g;
    auVar19 = (undefined1  [56])0x0;
    auVar23 = (undefined1  [56])0x0;
    rgb_03.g = (Float)(int)uVar18;
    rgb_03.b = (Float)(int)((ulong)uVar18 >> 0x20);
    rgb_03.r = FVar37;
    RGBUnboundedSpectrum::RGBUnboundedSpectrum
              ((RGBUnboundedSpectrum *)CONCAT44(fVar36,i),cs_00,rgb_03);
    SVar24 = RGBUnboundedSpectrum::Sample(this_00,lambda_00);
    auVar20._0_8_ = SVar24.values.values._8_8_;
    auVar20._8_56_ = auVar23;
    auVar14._0_8_ = SVar24.values.values._0_8_;
    auVar14._8_56_ = auVar19;
    uVar18 = vmovlpd_avx(auVar14._0_16_);
    local_10 = (int)uVar18;
    in_stack_fffffffffffffff4 = (float)((ulong)uVar18 >> 0x20);
    uVar18 = vmovlpd_avx(auVar20._0_16_);
    in_stack_fffffffffffffff8 = (float)uVar18;
    in_stack_fffffffffffffffc = (float)((ulong)uVar18 >> 0x20);
  }
  else if (*(int *)&(((MIPMap *)((long)in_RDI + 0x38))->pyramid).alloc.memoryResource == 1) {
    auVar19 = ZEXT856(0);
    rgb_00.b = FVar29;
    rgb_00._0_8_ = this_00;
    RVar25 = Clamp<int,int>(rgb_00,min,max);
    auVar15._0_8_ = RVar25._0_8_;
    auVar15._8_56_ = auVar19;
    vmovlpd_avx(auVar15._0_16_);
    auVar19 = (undefined1  [56])0x0;
    auVar23 = (undefined1  [56])0x0;
    rgb_02.g = (Float)(int)in_stack_fffffffffffffd90;
    rgb_02.b = (Float)(int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    rgb_02.r = (Float)((ulong)local_19c >> 0x20);
    RGBAlbedoSpectrum::RGBAlbedoSpectrum
              ((RGBAlbedoSpectrum *)CONCAT44(in_stack_fffffffffffffd74,uVar35),
               (RGBColorSpace *)CONCAT44(uVar34,FVar33),rgb_02);
    SVar24 = RGBAlbedoSpectrum::Sample
                       ((RGBAlbedoSpectrum *)CONCAT44(a,uVar28),
                        (SampledWavelengths *)CONCAT44(min,max));
    auVar21._0_8_ = SVar24.values.values._8_8_;
    auVar21._8_56_ = auVar23;
    auVar16._0_8_ = SVar24.values.values._0_8_;
    auVar16._8_56_ = auVar19;
    uVar18 = vmovlpd_avx(auVar16._0_16_);
    local_10 = (int)uVar18;
    in_stack_fffffffffffffff4 = (float)((ulong)uVar18 >> 0x20);
    uVar18 = vmovlpd_avx(auVar21._0_16_);
    in_stack_fffffffffffffff8 = (float)uVar18;
    in_stack_fffffffffffffffc = (float)((ulong)uVar18 >> 0x20);
  }
  else {
    auVar19 = (undefined1  [56])0x0;
    auVar23 = (undefined1  [56])0x0;
    rgb_04.g = (Float)(int)uVar18;
    rgb_04.b = (Float)(int)((ulong)uVar18 >> 0x20);
    rgb_04.r = FVar37;
    RGBIlluminantSpectrum::RGBIlluminantSpectrum
              ((RGBIlluminantSpectrum *)CONCAT44(fVar36,i),cs_00,rgb_04);
    SVar24 = RGBIlluminantSpectrum::Sample
                       ((RGBIlluminantSpectrum *)CONCAT44(in_stack_fffffffffffffd74,uVar35),
                        (SampledWavelengths *)CONCAT44(uVar34,FVar33));
    auVar22._0_8_ = SVar24.values.values._8_8_;
    auVar22._8_56_ = auVar23;
    auVar17._0_8_ = SVar24.values.values._0_8_;
    auVar17._8_56_ = auVar19;
    uVar18 = vmovlpd_avx(auVar17._0_16_);
    local_10 = (int)uVar18;
    in_stack_fffffffffffffff4 = (float)((ulong)uVar18 >> 0x20);
    uVar18 = vmovlpd_avx(auVar22._0_16_);
    in_stack_fffffffffffffff8 = (float)uVar18;
    in_stack_fffffffffffffffc = (float)((ulong)uVar18 >> 0x20);
  }
  aVar6.values[1] = in_stack_fffffffffffffff4;
  aVar6.values[0] = (float)local_10;
  aVar6.values[2] = in_stack_fffffffffffffff8;
  aVar6.values[3] = in_stack_fffffffffffffffc;
  return (array<float,_4>)(array<float,_4>)aVar6.values;
}

Assistant:

SampledSpectrum SpectrumImageTexture::Evaluate(TextureEvalContext ctx,
                                               SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    assert(!"Should not be called in GPU code");
    return SampledSpectrum(0);
#else
    // Apply texture mapping and flip $t$ coordinate for image texture lookup
    TexCoord2D c = mapping.Map(ctx);
    c.st[1] = 1 - c.st[1];

    // Lookup filtered RGB value in _MIPMap_
    RGB rgb = scale * mipmap->Filter<RGB>(c.st, {c.dsdx, c.dtdx}, {c.dsdy, c.dtdy});
    rgb = ClampZero(invert ? (RGB(1, 1, 1) - rgb) : rgb);

    // Return _SampledSpectrum_ for RGB image texture value
    if (const RGBColorSpace *cs = mipmap->GetRGBColorSpace(); cs) {
        if (spectrumType == SpectrumType::Unbounded)
            return RGBUnboundedSpectrum(*cs, rgb).Sample(lambda);
        else if (spectrumType == SpectrumType::Albedo)
            return RGBAlbedoSpectrum(*cs, Clamp(rgb, 0, 1)).Sample(lambda);
        else
            return RGBIlluminantSpectrum(*cs, rgb).Sample(lambda);
    }
    // otherwise it better be a one-channel texture
    DCHECK(rgb[0] == rgb[1] && rgb[1] == rgb[2]);
    return SampledSpectrum(rgb[0]);

#endif
}